

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>::format
          (BasicFormatter<char,_fmt::ArgFormatter<char>_> *this,BasicCStringRef<char> format_str)

{
  ulong uVar1;
  byte bVar2;
  Buffer<char> *pBVar3;
  byte *pbVar4;
  byte bVar5;
  size_t sVar6;
  Arg *pAVar7;
  FormatError *this_00;
  ptrdiff_t _Num;
  size_t sVar8;
  BasicCStringRef<char> __src;
  ptrdiff_t _Num_1;
  char *str;
  Arg arg;
  byte *local_78;
  CStringRef local_70;
  BasicStringRef<char> local_68;
  anon_union_16_12_986ea841_for_Value_0 local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (*format_str.data_ != '\0') {
    local_70.data_ = "cannot switch from automatic to manual argument indexing";
    __src.data_ = format_str.data_;
    do {
      local_78 = (byte *)format_str.data_ + 1;
      bVar2 = *format_str.data_;
      if ((bVar2 == 0x7d) || (bVar2 == 0x7b)) {
        bVar5 = *local_78;
        if (bVar5 == bVar2) {
          if ((byte *)__src.data_ != local_78) {
            sVar8 = (long)local_78 - (long)__src.data_;
            pBVar3 = this->writer_->buffer_;
            sVar6 = pBVar3->size_;
            uVar1 = sVar6 + sVar8;
            if (pBVar3->capacity_ < uVar1) {
              (**pBVar3->_vptr_Buffer)(pBVar3,uVar1);
              sVar6 = pBVar3->size_;
            }
            memmove(pBVar3->ptr_ + sVar6,__src.data_,sVar8);
            pBVar3->size_ = uVar1;
          }
          __src.data_ = (char *)(local_78 + 1);
          local_78 = (byte *)__src.data_;
        }
        else {
          if (bVar2 == 0x7d) {
            this_00 = (FormatError *)__cxa_allocate_exception(0x10);
            FormatError::FormatError(this_00,(CStringRef)0x112a2d);
            goto LAB_00107715;
          }
          if (__src.data_ != format_str.data_) {
            pBVar3 = this->writer_->buffer_;
            sVar6 = pBVar3->size_;
            uVar1 = sVar6 + ((long)format_str.data_ - (long)__src.data_);
            if (pBVar3->capacity_ < uVar1) {
              (**pBVar3->_vptr_Buffer)(pBVar3,uVar1);
              sVar6 = pBVar3->size_;
            }
            memmove(pBVar3->ptr_ + sVar6,__src.data_,(long)format_str.data_ - (long)__src.data_);
            pBVar3->size_ = uVar1;
            bVar5 = *local_78;
          }
          if ((bVar5 == 0x5f) || ((byte)((bVar5 & 0xdf) + 0xbf) < 0x1a)) {
            sVar6 = 1;
            do {
              do {
                local_68.size_ = sVar6;
                bVar2 = local_78[local_68.size_];
                sVar6 = local_68.size_ + 1;
              } while ((byte)(bVar2 - 0x30) < 10);
            } while ((bVar2 == 0x5f) || ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a));
            pbVar4 = local_78 + local_68.size_;
            local_68.data_ = (char *)local_78;
            if ((this->super_FormatterBase).next_arg_index_ < 1) {
              (this->super_FormatterBase).next_arg_index_ = -1;
              local_78 = local_78 + local_68.size_;
              internal::ArgMap<char>::init(&this->map_,(EVP_PKEY_CTX *)this);
              pAVar7 = internal::ArgMap<char>::find(&this->map_,&local_68);
              if (pAVar7 != (Arg *)0x0) {
                local_58.long_long_value = (pAVar7->super_Value).field_0.long_long_value;
                local_58.string.size = (pAVar7->super_Value).field_0.string.size;
                local_48 = *(undefined8 *)&pAVar7->type;
                uStack_40 = *(undefined8 *)&pAVar7->field_0x18;
                goto LAB_0010765f;
              }
              local_70.data_ = "argument not found";
              pbVar4 = local_78;
            }
            local_78 = pbVar4;
            this_00 = (FormatError *)__cxa_allocate_exception(0x10);
            FormatError::FormatError(this_00,local_70);
LAB_00107715:
            __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
          }
          parse_arg_index((Arg *)&local_58.string,this,(Char **)&local_78);
LAB_0010765f:
          __src.data_ = format(this,(Char **)&local_78,(Arg *)&local_58.string);
          local_78 = (byte *)__src.data_;
        }
      }
      format_str.data_ = (char *)local_78;
    } while (*local_78 != 0);
    if ((byte *)__src.data_ != local_78) {
      sVar8 = (long)local_78 - (long)__src.data_;
      pBVar3 = this->writer_->buffer_;
      sVar6 = pBVar3->size_;
      uVar1 = sVar6 + sVar8;
      if (pBVar3->capacity_ < uVar1) {
        (**pBVar3->_vptr_Buffer)(pBVar3,uVar1);
        sVar6 = pBVar3->size_;
      }
      memmove(pBVar3->ptr_ + sVar6,__src.data_,sVar8);
      pBVar3->size_ = uVar1;
    }
  }
  return;
}

Assistant:

void BasicFormatter<Char, AF>::format(BasicCStringRef<Char> format_str) {
  const Char *s = format_str.c_str();
  const Char *start = s;
  while (*s) {
    Char c = *s++;
    if (c != '{' && c != '}') continue;
    if (*s == c) {
      write(writer_, start, s);
      start = ++s;
      continue;
    }
    if (c == '}')
      FMT_THROW(FormatError("unmatched '}' in format string"));
    write(writer_, start, s - 1);
    internal::Arg arg = internal::is_name_start(*s) ?
          parse_arg_name(s) : parse_arg_index(s);
    start = s = format(s, arg);
  }
  write(writer_, start, s);
}